

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

int Fx_ManDivFindCubeFree(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *__s;
  int *piVar8;
  int *piVar9;
  
  piVar8 = vArr1->pArray + 1;
  piVar9 = vArr2->pArray + 1;
  iVar4 = vArr1->nSize;
  piVar1 = vArr1->pArray + iVar4;
  iVar6 = vArr2->nSize;
  piVar2 = vArr2->pArray + iVar6;
  vCubeFree->nSize = 0;
  if (iVar6 < 2 || (long)iVar4 < 2) {
    iVar6 = 1;
    iVar5 = 0;
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    iVar6 = 1;
    iVar5 = 0;
    do {
      iVar7 = *piVar8;
      iVar3 = *piVar9;
      if (iVar7 == iVar3) {
        piVar8 = piVar8 + 1;
        piVar9 = piVar9 + 1;
        iVar5 = iVar5 + 1;
      }
      else {
        if (iVar7 < iVar3) {
          if (iVar7 < 0) goto LAB_00266b14;
          piVar8 = piVar8 + 1;
          iVar7 = iVar4 + iVar7 * 2;
        }
        else {
          if (iVar3 < 0) goto LAB_00266b14;
          piVar9 = piVar9 + 1;
          if (vCubeFree->nSize == 0) {
            iVar6 = 0;
            iVar4 = 1;
          }
          iVar7 = iVar6 + iVar3 * 2;
        }
        Vec_IntPush(vCubeFree,iVar7);
      }
    } while ((piVar8 < piVar1) && (piVar9 < piVar2));
  }
  for (; piVar8 < piVar1; piVar8 = piVar8 + 1) {
    if (*piVar8 < 0) goto LAB_00266b14;
    Vec_IntPush(vCubeFree,iVar4 + *piVar8 * 2);
  }
  for (; piVar9 < piVar2; piVar9 = piVar9 + 1) {
    if (*piVar9 < 0) {
LAB_00266b14:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf1,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(vCubeFree,iVar6 + *piVar9 * 2);
  }
  iVar4 = vCubeFree->nSize;
  if (iVar4 == 0) {
    __s = "The SOP has duplicated cubes.";
  }
  else {
    if (iVar4 != 1) goto LAB_00266aee;
    __s = "The SOP has contained cubes.";
  }
  puts(__s);
  iVar4 = vCubeFree->nSize;
LAB_00266aee:
  if (iVar4 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (*vCubeFree->pArray < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf3,"int Abc_LitIsCompl(int)");
  }
  if ((*vCubeFree->pArray & 1U) != 0) {
    __assert_fail("!Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0))",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                  ,0x29e,"int Fx_ManDivFindCubeFree(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int *)");
  }
  return iVar5;
}

Assistant:

int Fx_ManDivFindCubeFree( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vArr1->pArray + 1;  // skip variable ID
    int * pBeg2 = vArr2->pArray + 1;  // skip variable ID
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    int Counter = 0, fAttr0 = 0, fAttr1 = 1;
    Vec_IntClear( vCubeFree );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            pBeg1++, pBeg2++, Counter++;
        else if ( *pBeg1 < *pBeg2 )
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
        else  
        {
            if ( Vec_IntSize(vCubeFree) == 0 )
                fAttr0 = 1, fAttr1 = 0;
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
        }
    }
    while ( pBeg1 < pEnd1 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
    while ( pBeg2 < pEnd2 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
    if ( Vec_IntSize(vCubeFree) == 0 )
        printf( "The SOP has duplicated cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 1 )
        printf( "The SOP has contained cubes.\n" );
//    else if ( Vec_IntSize(vCubeFree) == 2 && Abc_Lit2Var(Abc_Lit2Var(Vec_IntEntry(vCubeFree, 0))) == Abc_Lit2Var(Abc_Lit2Var(Vec_IntEntry(vCubeFree, 1))) && !*fWarning )
//        printf( "The SOP has distance-1 cubes or it is not a prime cover.  Please make sure the result verifies.\n" ), *fWarning = 1;
    assert( !Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0)) );
    return Counter;
}